

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O0

int mpack_node_int(mpack_node_t node)

{
  int32_t iVar1;
  mpack_node_t node_local;
  
  iVar1 = mpack_node_i32(node);
  return iVar1;
}

Assistant:

MPACK_INLINE int mpack_node_int(mpack_node_t node) {

    // This should be true at compile-time, so this just wraps the 32-bit function.
    if (sizeof(int) == 4)
        return (int)mpack_node_i32(node);

    // Otherwise we use i64 and check the range.
    int64_t val = mpack_node_i64(node);
    if (val >= INT_MIN && val <= INT_MAX)
        return (int)val;

    mpack_node_flag_error(node, mpack_error_type);
    return 0;
}